

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_next_on_map(uint32_t count)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int64_t k;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  char *pcVar11;
  char *d2;
  byte *local_40;
  char *local_38;
  
  _space((FILE *)_stdout);
  lVar10 = 1;
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"next/check on map(%u)",count);
  fputc(10,_stdout);
  if (count < 0x10) {
    buf[1] = (byte)count | 0x80;
  }
  else if (count < 0x10000) {
    buf[1] = -0x22;
    uVar2 = (ushort)count << 8 | (ushort)count >> 8;
    buf[2] = (char)uVar2;
    buf[3] = (char)(uVar2 >> 8);
    lVar10 = 3;
  }
  else {
    buf[1] = -0x21;
    buf._2_4_ = count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
    lVar10 = 5;
  }
  pcVar11 = buf + lVar10 + 1;
  iVar3 = count * 2;
  if (iVar3 != 0) {
    uVar4 = 0;
    iVar6 = iVar3;
    do {
      iVar7 = (int)(uVar4 * 0x2040811 >> 0x20);
      uVar8 = ((uint)((int)uVar4 - iVar7) >> 1) + iVar7 >> 6;
      *pcVar11 = (char)uVar4 - ((char)(uVar8 << 7) - (char)uVar8);
      pcVar11 = pcVar11 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  iVar6 = 1;
  if (0xf < count) {
    iVar6 = (0xffff < count) + 3 + (uint)(0xffff < count);
  }
  uVar8 = iVar6 + iVar3;
  pbVar9 = (byte *)(ulong)uVar8;
  local_38 = buf + 1;
  iVar3 = mp_check(&local_38,str);
  _ok((uint)(iVar3 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d4,
      "mp_check(map %u))",count);
  _ok((uint)((byte *)(pcVar11 + -0x15b121) == pbVar9),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d5,
      "len(map %u) == %u",count,uVar8);
  _ok((uint)((byte *)(local_38 + -0x15b121) == pbVar9),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d6,
      "len(mp_check(map %u)) == %u",count,uVar8);
  local_40 = (byte *)(buf + 1);
  k = 1;
  do {
    pbVar5 = local_40 + 1;
    lVar10 = (long)""[*local_40];
    if (lVar10 < 0) {
      if (*local_40 == 0xd9) {
        pbVar5 = local_40 + (ulong)local_40[1] + 2;
      }
      else {
        if ((byte)""[*local_40] < 0xe1) {
          mp_next_slowpath((char **)&local_40,k);
          break;
        }
        k = k - lVar10;
      }
    }
    else {
      pbVar5 = pbVar5 + lVar10;
    }
    bVar1 = 1 < k;
    local_40 = pbVar5;
    k = k + -1;
  } while (bVar1);
  _ok((uint)(local_40 + -0x15b121 == pbVar9),"(d3 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2d8,
      "len(mp_next(map %u)) == %u",count,uVar8);
  return;
}

Assistant:

static void
test_next_on_map(uint32_t count)
{
	note("next/check on map(%u)", count);
	char *d1 = data;
	d1 = mp_encode_map(d1, count);
	for (uint32_t i = 0; i < 2 * count; i++) {
		d1 = mp_encode_uint(d1, i % 0x7f); /* one byte */
	}
	uint32_t len = 2 * count + mp_sizeof_map(count);
	const char *d2 = data;
	const char *d3 = data;
	ok(!mp_check(&d2, data + BUF_MAXLEN), "mp_check(map %u))", count);
	is((d1 - data), (ptrdiff_t)len, "len(map %u) == %u", count, len);
	is((d2 - data), (ptrdiff_t)len, "len(mp_check(map %u)) == %u", count, len);
	mp_next(&d3);
	is((d3 - data), (ptrdiff_t)len, "len(mp_next(map %u)) == %u", count, len);
}